

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O1

void integralEquationIteration<long_double>
               (QuickselectParams<long_double> *quickselectParams,
               vector<long_double,_std::allocator<long_double>_> *fOld,
               vector<long_double,_std::allocator<long_double>_> *fNewOut)

{
  long lVar1;
  longdouble lVar2;
  QuickselectParams<long_double> *pQVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  pointer plVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  long lVar8;
  uint uVar9;
  uint l;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble lVar23;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t;
  longdouble local_230;
  longdouble local_224;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  longdouble local_170;
  longdouble local_164;
  longdouble local_158;
  longdouble local_14c;
  long local_140;
  longdouble local_134;
  long local_128;
  vector<long_double,_std::allocator<long_double>_> *local_120;
  QuickselectParams<long_double> *local_118;
  ulong local_110;
  double local_108;
  double local_100;
  double local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  double local_d8;
  longdouble local_cc;
  longdouble local_c0;
  longdouble local_b4;
  longdouble local_a8;
  longdouble local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_e8 = (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_128 = local_e8 >> 4;
  local_d8 = 1.0 / (double)local_128;
  local_134 = (longdouble)local_d8;
  if (0 < local_128) {
    lVar8 = (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    local_e8 = local_e8 >> 3;
    local_cc = (longdouble)local_e8;
    local_158 = (longdouble)lVar8;
    lVar1 = lVar8 + -1;
    local_140 = 0;
    local_120 = fNewOut;
    local_118 = quickselectParams;
    local_e0 = lVar8;
    do {
      pQVar3 = local_118;
      local_f0 = local_140 * 2 + 1;
      lVar15 = (longdouble)local_f0 / local_cc;
      (*local_118->_vptr_QuickselectParams[1])(&local_188,local_118);
      uVar11 = (long)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      (**pQVar3->_vptr_QuickselectParams)(pQVar3);
      iVar13 = *local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_188);
      uVar4 = tRight(&local_78,1);
      uVar5 = extraout_EDX;
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar5 = extraout_EDX_00;
      }
      lVar16 = local_134 * ((longdouble)1 - lVar15);
      uVar10 = (ulong)(uVar4 + 1);
      beta<long_double>((longdouble *)(ulong)(iVar13 + 1U),uVar4 + 1,uVar5);
      lVar17 = lVar16 / in_ST1;
      local_14c = ((longdouble)1 - lVar15) / lVar16;
      lVar19 = (longdouble)0;
      in_ST1 = in_ST4;
      lVar22 = in_ST5;
      if (lVar19 < local_14c) {
        iVar12 = 1;
        lVar19 = (longdouble)0;
        lVar18 = lVar19;
        lVar21 = in_ST2;
        lVar14 = in_ST3;
        do {
          in_ST1 = lVar22;
          in_ST3 = in_ST5;
          in_ST2 = in_ST4;
          lVar18 = lVar15 + lVar16 * (longdouble)0.5 + lVar16 * lVar18;
          local_f8 = (double)(local_158 * (lVar15 / lVar18));
          in_ST5 = in_ST1;
          lVar22 = in_ST1;
          dVar24 = floor(local_f8);
          lVar6 = (long)dVar24;
          if (lVar8 <= (long)dVar24) {
            lVar6 = lVar1;
          }
          lVar20 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
          pow<long_double>((longdouble *)(ulong)(iVar13 + 1U),lVar18,(uint)uVar10);
          pow<long_double>((longdouble *)(ulong)uVar4,(longdouble)1 - lVar18,(uint)uVar10);
          lVar19 = lVar19 + lVar21 * lVar20 * lVar14;
          lVar18 = (longdouble)iVar12;
          iVar12 = iVar12 + 1;
          lVar21 = in_ST2;
          lVar14 = in_ST3;
          in_ST4 = in_ST1;
        } while (lVar18 < local_14c);
      }
      in_ST4 = lVar22;
      lVar19 = in_ST0 + lVar17 * lVar19;
      iVar13 = *(int *)((long)local_188.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       ((long)(uVar11 * 0x40000000 + -0x100000000) >> 0x1e));
      plVar7 = (pointer)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,&local_188);
      l = (uint)(uVar11 >> 2);
      uVar4 = tLeft(&local_48,l);
      uVar5 = extraout_EDX_01;
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar5 = extraout_EDX_02;
      }
      lVar17 = lVar15 * local_134;
      uVar9 = iVar13 + 1;
      uVar11 = (ulong)(uVar4 + 1);
      beta<long_double>((longdouble *)(ulong)uVar9,uVar4 + 1,uVar5);
      lVar18 = lVar17 / in_ST2;
      local_164 = lVar15 / lVar17;
      local_230 = (longdouble)0;
      in_ST0 = in_ST3;
      in_ST2 = in_ST5;
      lVar22 = in_ST4;
      if (local_230 < local_164) {
        lVar21 = (longdouble)0;
        lVar20 = lVar17 * (longdouble)0.5 + lVar21;
        iVar13 = 1;
        lVar14 = in_ST1;
        local_230 = lVar21;
        do {
          in_ST1 = lVar22;
          in_ST0 = in_ST5;
          lVar21 = lVar20 + lVar21 * lVar17;
          local_100 = (double)(local_158 * ((lVar15 - lVar21) / ((longdouble)1 - lVar21)));
          in_ST2 = in_ST1;
          lVar22 = in_ST1;
          in_ST4 = in_ST1;
          dVar24 = floor(local_100);
          lVar6 = (long)dVar24;
          if (lVar8 <= (long)dVar24) {
            lVar6 = lVar1;
          }
          plVar7 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar23 = plVar7[lVar6];
          pow<long_double>((longdouble *)(ulong)uVar9,(longdouble)1 - lVar21,(uint)uVar11);
          pow<long_double>((longdouble *)(ulong)uVar4,lVar21,(uint)uVar11);
          local_230 = local_230 + in_ST3 * lVar23 * lVar14;
          lVar21 = (longdouble)iVar13;
          iVar13 = iVar13 + 1;
          in_ST3 = in_ST0;
          lVar14 = in_ST1;
          in_ST5 = in_ST2;
        } while (lVar21 < local_164);
      }
      in_ST3 = lVar22;
      local_170 = lVar19 + local_230 * lVar18;
      if (2 < (int)l) {
        local_c0 = lVar17 * lVar16;
        local_a8 = (longdouble)0 + lVar17 * (longdouble)0.5;
        local_9c = lVar15 + lVar16 * (longdouble)0.5;
        uVar11 = 2;
        in_ST4 = in_ST3;
        do {
          lVar19 = in_ST4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,&local_188);
          uVar5 = tLeft(&local_60,(int)uVar11);
          if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar13 = *(int *)((long)local_188.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (uVar11 - 1) * 4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,&local_188);
          local_110 = uVar11;
          uVar4 = tRight(&local_90,(int)uVar11);
          if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar9 = iVar13 + 1;
          uVar11 = (ulong)uVar9;
          beta<long_double>((longdouble *)(ulong)(uVar5 + 1),uVar9,uVar4 + 1,(uint)plVar7);
          local_224 = (longdouble)0;
          local_b4 = local_c0 / in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          lVar22 = in_ST3;
          lVar18 = in_ST4;
          if (local_224 < local_164) {
            iVar13 = 0;
            lVar21 = (longdouble)0;
            local_224 = lVar21;
            do {
              lVar22 = (longdouble)0;
              if (lVar22 < local_14c) {
                lVar20 = local_a8 + lVar17 * lVar21;
                iVar12 = 1;
                lVar18 = in_ST0;
                lVar21 = in_ST2;
                lVar14 = in_ST3;
                lVar19 = in_ST4;
                do {
                  in_ST2 = lVar19;
                  in_ST0 = in_ST4;
                  lVar22 = local_9c + lVar16 * lVar22;
                  lVar23 = lVar22 - lVar20;
                  local_108 = (double)(local_158 * ((lVar15 - lVar20) / lVar23));
                  in_ST3 = in_ST2;
                  in_ST4 = in_ST2;
                  dVar24 = floor(local_108);
                  lVar6 = (long)dVar24;
                  if (lVar8 <= (long)dVar24) {
                    lVar6 = lVar1;
                  }
                  plVar7 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar2 = plVar7[lVar6];
                  lVar19 = in_ST4;
                  pow<long_double>((longdouble *)(ulong)uVar5,lVar20,(uint)uVar11);
                  pow<long_double>((longdouble *)(ulong)uVar9,lVar23,(uint)uVar11);
                  pow<long_double>((longdouble *)(ulong)uVar4,(longdouble)1 - lVar22,(uint)uVar11);
                  local_224 = local_224 + lVar21 * lVar18 * lVar2 * lVar14;
                  lVar22 = (longdouble)iVar12;
                  iVar12 = iVar12 + 1;
                  lVar18 = in_ST0;
                  lVar21 = in_ST2;
                  lVar14 = in_ST3;
                } while (lVar22 < local_14c);
              }
              iVar13 = iVar13 + 1;
              lVar21 = (longdouble)iVar13;
              in_ST1 = in_ST2;
              lVar22 = in_ST3;
              lVar18 = in_ST4;
            } while (lVar21 < local_164);
          }
          in_ST4 = lVar19;
          in_ST3 = lVar18;
          in_ST2 = lVar22;
          local_170 = local_170 + local_224 * local_b4;
          uVar11 = local_110 + 1;
        } while (uVar11 != (l & 0x7fffffff));
      }
      (local_120->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
      super__Vector_impl_data._M_start[local_140] = local_170;
      in_ST5 = in_ST4;
      if ((pointer)local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_140 = local_140 + 1;
    } while (local_140 != local_128);
  }
  return;
}

Assistant:

void integralEquationIteration(const QuickselectParams<Num> * quickselectParams,
                               const vector<Num> & fOld, vector<Num> & fNewOut) {
	const long L = fNewOut.size();
	const long LOld = fOld.size();
	const Num Delta = 1.0 / L;

	for (int i = 0; i < L; ++i) {
		auto alpha = alphaForIndex<Num>(i, L);
		const vector<unsigned int> t = quickselectParams->samplingParameter(alpha);
		auto s = static_cast<int>(t.size());

		// partitioning costs
		Num newValue = quickselectParams->partitioningCosts(alpha);
		// first integral (left call)
		{
			const unsigned int t1 = t[0], t2 = tRight(t, 1) ;
			Num step = Delta * (1 - alpha);
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < (1-alpha) / step; ++j) {
				Num u = alpha + step/2 + j*step;
//			}
//			for (Num u = alpha + step / 2; u < 1; u += step) {
				Num summand = fOld[indexForAlpha(alpha / u, LOld)]
				              * pow(u,t1+1) * pow(1-u,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// second integral (right call)
		{
			const unsigned int t1 = t[s-1], t2 = tLeft(t, s) ;
			Num step = Delta * alpha;
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < alpha / step; ++j) {
				Num v = 0 + step/2 + j*step;
//			for (Num v = 0 + step / 2; v < alpha; v += step) {
				Num summand = fOld[indexForAlpha((alpha-v) / (1-v), LOld)]
				              * pow(1-v,t1+1) * pow(v,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// third integrals (middle calls)
		for (int l = 2; l <= s-1; ++l) {
			const unsigned int t1 = tLeft(t,l), t2 = t[l-1], t3 = tRight(t,l) ;
			Num step1 = Delta * alpha, step2 = Delta * (1-alpha);
			const Num commonFactor = step1 * step2 / beta<Num>(t1 + 1, t2 + 1, t3 + 1);
			Num sum = 0;
			for (int j1 = 0; j1 < alpha / step1; ++j1) {
				for (int j2 = 0; j2 < (1 - alpha) / step2; ++j2) {
					Num u = 0 + step1 / 2 + j1 * step1;
					Num v = alpha + step2 / 2 + j2 * step2;
					Num summand = fOld[indexForAlpha((alpha - u) / (v - u), LOld)]
					              * pow(u,t1) * pow(v - u, t2 + 1) * pow(1-v, t3) ;
					sum += summand;
				}
			}
			newValue += sum * commonFactor;
		}

		fNewOut[i] = newValue;
	}

}